

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lalr.c
# Opt level: O3

void traverse(int i)

{
  int iVar1;
  uint *puVar2;
  Yshort *pYVar3;
  Yshort *pYVar4;
  uint uVar5;
  int iVar6;
  long lVar7;
  uint *puVar8;
  ulong uVar9;
  int iVar10;
  uint *puVar11;
  long lVar12;
  uint *puVar13;
  uint *puVar14;
  
  pYVar4 = VERTICES;
  lVar7 = (long)top;
  iVar10 = top + 1;
  top = iVar10;
  VERTICES[lVar7 + 1] = i;
  pYVar3 = INDEX;
  INDEX[i] = iVar10;
  puVar2 = F;
  iVar1 = tokensetsize;
  lVar7 = (long)tokensetsize;
  puVar14 = F + tokensetsize * i;
  puVar13 = (uint *)R[i];
  if ((puVar13 != (uint *)0x0) && (uVar5 = *puVar13, -1 < (int)uVar5)) {
    do {
      iVar6 = pYVar3[uVar5];
      if (iVar6 == 0) {
        traverse(uVar5);
        iVar6 = pYVar3[uVar5];
      }
      if (iVar6 < pYVar3[i]) {
        pYVar3[i] = iVar6;
      }
      if (0 < iVar1) {
        puVar8 = puVar2 + (long)(int)uVar5 * (long)tokensetsize;
        puVar11 = puVar14;
        do {
          *puVar11 = *puVar11 | *puVar8;
          puVar8 = puVar8 + 1;
          puVar11 = puVar11 + 1;
        } while (puVar11 < puVar14 + lVar7);
      }
      puVar13 = puVar13 + 1;
      uVar5 = *puVar13;
    } while (-1 < (int)uVar5);
    if (pYVar3[i] != iVar10) {
      return;
    }
  }
  iVar6 = infinity;
  uVar9 = (ulong)(top - 1U);
  iVar10 = pYVar4[top];
  lVar12 = (long)iVar10;
  pYVar3[lVar12] = infinity;
  if (iVar10 != i) {
    uVar9 = (ulong)(int)(top - 1U);
    do {
      if (0 < iVar1) {
        puVar11 = puVar2 + (long)(int)lVar12 * (long)tokensetsize;
        puVar13 = puVar14;
        do {
          uVar5 = *puVar13;
          puVar13 = puVar13 + 1;
          *puVar11 = uVar5;
          puVar11 = puVar11 + 1;
        } while (puVar13 < puVar14 + lVar7);
      }
      iVar10 = pYVar4[uVar9];
      lVar12 = (long)iVar10;
      uVar9 = uVar9 - 1;
      pYVar3[lVar12] = iVar6;
    } while (iVar10 != i);
  }
  top = (int)uVar9;
  return;
}

Assistant:

void traverse(int i)
{
  register unsigned *fp1;
  register unsigned *fp2;
  register unsigned *fp3;
  register int j;
  register Yshort *rp;

  int height;
  unsigned *base;

  VERTICES[++top] = i;
  INDEX[i] = height = top;

  base = F + i * tokensetsize;
  fp3 = base + tokensetsize;

  rp = R[i];
  if (rp)
    {
      while ((j = *rp++) >= 0)
	{
	  if (INDEX[j] == 0)
	    traverse(j);

	  if (INDEX[i] > INDEX[j])
	    INDEX[i] = INDEX[j];

	  fp1 = base;
	  fp2 = F + j * tokensetsize;

	  while (fp1 < fp3)
	    *fp1++ |= *fp2++;
	}
    }

  if (INDEX[i] == height)
    {
      for (;;)
	{
	  j = VERTICES[top--];
	  INDEX[j] = infinity;

	  if (i == j)
	    break;

	  fp1 = base;
	  fp2 = F + j * tokensetsize;

	  while (fp1 < fp3)
	    *fp2++ = *fp1++;
	}
    }
}